

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonPrettyFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  long in_FS_OFFSET;
  JsonString s;
  JsonPretty local_d8;
  JsonString local_b0;
  long local_28;
  size_t sVar2;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x88);
  local_d8.pParse = (JsonParse *)0x0;
  local_d8.pOut = (JsonString *)0x0;
  local_d8.zIndent = (char *)0x0;
  local_d8.szIndent = 0;
  local_d8.nIndent = 0;
  local_d8.pParse = jsonParseFuncArg(ctx,*argv,0);
  if (local_d8.pParse == (JsonParse *)0x0) goto LAB_001b97ca;
  local_b0.zBuf = local_b0.zSpace;
  local_b0.nAlloc = 100;
  local_b0.nUsed = 0;
  local_b0.bStatic = '\x01';
  local_b0.eErr = '\0';
  local_d8.pOut = &local_b0;
  local_b0.pCtx = ctx;
  if (argc == 1) {
LAB_001b9793:
    local_d8.zIndent = "    ";
    uVar1 = 4;
  }
  else {
    local_d8.zIndent = (char *)sqlite3ValueText(argv[1],'\x01');
    if (local_d8.zIndent == (char *)0x0) goto LAB_001b9793;
    sVar2 = strlen(local_d8.zIndent);
    uVar1 = (u32)sVar2;
  }
  local_d8.szIndent = uVar1;
  jsonTranslateBlobToPrettyText(&local_d8,0);
  jsonReturnString(&local_b0,(JsonParse *)0x0,(sqlite3_context *)0x0);
  jsonParseFree(local_d8.pParse);
LAB_001b97ca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonPrettyFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString s;          /* The output string */
  JsonPretty x;          /* Pretty printing context */

  memset(&x, 0, sizeof(x));
  x.pParse = jsonParseFuncArg(ctx, argv[0], 0);
  if( x.pParse==0 ) return;
  x.pOut = &s;
  jsonStringInit(&s, ctx);
  if( argc==1 || (x.zIndent = (const char*)sqlite3_value_text(argv[1]))==0 ){
    x.zIndent = "    ";
    x.szIndent = 4;
  }else{
    x.szIndent = (u32)strlen(x.zIndent);
  }
  jsonTranslateBlobToPrettyText(&x, 0);
  jsonReturnString(&s, 0, 0);
  jsonParseFree(x.pParse);
}